

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

nsync_dll_list_ nsync_remove_from_mu_queue_(nsync_dll_list_ mu_queue,nsync_dll_element_ *e)

{
  int *piVar1;
  nsync_dll_element_ *p;
  nsync_dll_element_ *n;
  void *pvVar2;
  int iVar3;
  nsync_dll_list_ list;
  long *plVar4;
  nsync_dll_element_ *pnVar5;
  bool bVar6;
  nsync_dll_element_ *e_same_condition;
  uint32_t old_value;
  nsync_dll_element_ *next;
  nsync_dll_element_ *prev;
  nsync_dll_element_ *e_local;
  nsync_dll_list_ mu_queue_local;
  
  p = e->prev;
  n = e->next;
  list = nsync_dll_remove_(mu_queue,e);
  do {
    iVar3 = *(int *)((long)e->container + 0x48);
    piVar1 = (int *)((long)e->container + 0x48);
    LOCK();
    bVar6 = iVar3 == *piVar1;
    if (bVar6) {
      *piVar1 = iVar3 + 1;
    }
    UNLOCK();
  } while (!bVar6);
  iVar3 = nsync_dll_is_empty_(list);
  if (iVar3 == 0) {
    pvVar2 = e->container;
    plVar4 = (long *)((long)pvVar2 + 0x68);
    if ((long *)*plVar4 == plVar4) {
      pnVar5 = nsync_dll_last_(list);
      if (p != pnVar5) {
        nsync_maybe_merge_conditions_(p,n);
      }
    }
    else {
      *(undefined8 *)(*plVar4 + 8) = *(undefined8 *)((long)pvVar2 + 0x70);
      **(long **)((long)pvVar2 + 0x70) = *plVar4;
      *plVar4 = (long)plVar4;
      *(long **)((long)pvVar2 + 0x70) = plVar4;
    }
  }
  return list;
}

Assistant:

nsync_dll_list_ nsync_remove_from_mu_queue_ (nsync_dll_list_ mu_queue, nsync_dll_element_ *e) {
	/* Record previous and next elements in the original queue. */
	nsync_dll_element_ *prev = e->prev;
	nsync_dll_element_ *next = e->next;
	uint32_t old_value;
	/* Remove. */
	mu_queue = nsync_dll_remove_ (mu_queue, e);
        do {    
                old_value = ATM_LOAD (&DLL_WAITER (e)->remove_count);
        } while (!ATM_CAS (&DLL_WAITER (e)->remove_count, old_value, old_value+1));
	if (!nsync_dll_is_empty_ (mu_queue)) {
		/* Fix up same_condition. */
		nsync_dll_element_ *e_same_condition = &DLL_WAITER (e)->same_condition;

		if (e_same_condition->next != e_same_condition) {
			/* *e is linked to a same_condition neighbour---just remove it. */
			e_same_condition->next->prev = e_same_condition->prev;
			e_same_condition->prev->next = e_same_condition->next;
			e_same_condition->next = e_same_condition;
			e_same_condition->prev = e_same_condition;
		} else if (prev != nsync_dll_last_ (mu_queue)) {
			/* Merge the new neighbours together if we can. */
			nsync_maybe_merge_conditions_ (prev, next);
		}
	}
	return (mu_queue);
}